

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void do_ssi_include(mg_connection *conn,char *ssi,char *tag,int include_level)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  ptrdiff_t pVar4;
  int local_2264;
  size_t sStack_2260;
  int truncated;
  size_t len;
  mg_file file;
  char *p;
  char path [512];
  char file_name [8192];
  int include_level_local;
  char *tag_local;
  char *ssi_local;
  mg_connection *conn_local;
  
  memset(&len,0,0x28);
  local_2264 = 0;
  if (conn != (mg_connection *)0x0) {
    iVar1 = __isoc99_sscanf(tag," virtual=\"%511[^\"]\"",path + 0x1f8);
    if (iVar1 == 1) {
      mg_snprintf(conn,&local_2264,(char *)&p,0x200,"%s/%s",conn->dom_ctx->config[0xf],path + 0x1f8)
      ;
    }
    else {
      iVar1 = __isoc99_sscanf(tag," abspath=\"%511[^\"]\"",path + 0x1f8);
      if (iVar1 == 1) {
        mg_snprintf(conn,&local_2264,(char *)&p,0x200,"%s",path + 0x1f8);
      }
      else {
        iVar1 = __isoc99_sscanf(tag," file=\"%511[^\"]\"",path + 0x1f8);
        if ((iVar1 != 1) && (iVar1 = __isoc99_sscanf(tag," \"%511[^\"]\"",path + 0x1f8), iVar1 != 1)
           ) {
          mg_cry_internal_wrap
                    (conn,(mg_context *)0x0,"do_ssi_include",0x307d,"Bad SSI #include: [%s]",tag);
          return;
        }
        mg_snprintf(conn,&local_2264,(char *)&p,0x200,"%s",ssi);
        if (local_2264 == 0) {
          file.access.fp = (FILE *)strrchr((char *)&p,0x2f);
          if (file.access.fp != (FILE *)0x0) {
            *(char *)((long)&(file.access.fp)->_flags + 1) = '\0';
          }
          sStack_2260 = strlen((char *)&p);
          mg_snprintf(conn,&local_2264,path + (sStack_2260 - 8),0x200 - sStack_2260,"%s",
                      path + 0x1f8);
        }
      }
    }
    if (local_2264 == 0) {
      iVar1 = mg_fopen(conn,(char *)&p,1,(mg_file *)&len);
      if (iVar1 == 0) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        mg_cry_internal_wrap
                  (conn,(mg_context *)0x0,"do_ssi_include",0x308b,
                   "Cannot open SSI #include: [%s]: fopen(%s): %s",tag,&p,pcVar3);
      }
      else {
        fclose_on_exec((mg_file_access *)&file.stat.location,conn);
        pVar4 = match_prefix_strlen(conn->dom_ctx->config[0x20],(char *)&p);
        if (pVar4 < 1) {
          send_file_data(conn,(mg_file *)&len,0,0x7fffffffffffffff,0);
        }
        else {
          send_ssi_file(conn,(char *)&p,(mg_file *)&len,include_level + 1);
        }
        mg_fclose((mg_file_access *)&file.stat.location);
      }
    }
    else {
      mg_cry_internal_wrap
                (conn,(mg_context *)0x0,"do_ssi_include",0x3082,
                 "SSI #include path length overflow: [%s]",tag);
    }
  }
  return;
}

Assistant:

static void
do_ssi_include(struct mg_connection *conn,
               const char *ssi,
               char *tag,
               int include_level)
{
	char file_name[MG_BUF_LEN], path[512], *p;
	struct mg_file file = STRUCT_FILE_INITIALIZER;
	size_t len;
	int truncated = 0;

	if (conn == NULL) {
		return;
	}

	/* sscanf() is safe here, since send_ssi_file() also uses buffer
	 * of size MG_BUF_LEN to get the tag. So strlen(tag) is
	 * always < MG_BUF_LEN. */
	if (sscanf(tag, " virtual=\"%511[^\"]\"", file_name) == 1) {
		/* File name is relative to the webserver root */
		file_name[511] = 0;
		(void)mg_snprintf(conn,
		                  &truncated,
		                  path,
		                  sizeof(path),
		                  "%s/%s",
		                  conn->dom_ctx->config[DOCUMENT_ROOT],
		                  file_name);

	} else if (sscanf(tag, " abspath=\"%511[^\"]\"", file_name) == 1) {
		/* File name is relative to the webserver working directory
		 * or it is absolute system path */
		file_name[511] = 0;
		(void)
		    mg_snprintf(conn, &truncated, path, sizeof(path), "%s", file_name);

	} else if ((sscanf(tag, " file=\"%511[^\"]\"", file_name) == 1)
	           || (sscanf(tag, " \"%511[^\"]\"", file_name) == 1)) {
		/* File name is relative to the current document */
		file_name[511] = 0;
		(void)mg_snprintf(conn, &truncated, path, sizeof(path), "%s", ssi);

		if (!truncated) {
			if ((p = strrchr(path, '/')) != NULL) {
				p[1] = '\0';
			}
			len = strlen(path);
			(void)mg_snprintf(conn,
			                  &truncated,
			                  path + len,
			                  sizeof(path) - len,
			                  "%s",
			                  file_name);
		}

	} else {
		mg_cry_internal(conn, "Bad SSI #include: [%s]", tag);
		return;
	}

	if (truncated) {
		mg_cry_internal(conn, "SSI #include path length overflow: [%s]", tag);
		return;
	}

	if (!mg_fopen(conn, path, MG_FOPEN_MODE_READ, &file)) {
		mg_cry_internal(conn,
		                "Cannot open SSI #include: [%s]: fopen(%s): %s",
		                tag,
		                path,
		                strerror(ERRNO));
	} else {
		fclose_on_exec(&file.access, conn);
		if (match_prefix_strlen(conn->dom_ctx->config[SSI_EXTENSIONS], path)
		    > 0) {
			send_ssi_file(conn, path, &file, include_level + 1);
		} else {
			send_file_data(conn, &file, 0, INT64_MAX, 0); /* send static file */
		}
		(void)mg_fclose(&file.access); /* Ignore errors for readonly files */
	}
}